

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool __thiscall cmState::GetCacheEntryPropertyAsBool(cmState *this,string *key,string *propertyName)

{
  bool bVar1;
  pointer this_00;
  char *key_00;
  CacheIterator local_30;
  string *local_20;
  string *propertyName_local;
  string *key_local;
  cmState *this_local;
  
  local_20 = propertyName;
  propertyName_local = key;
  key_local = (string *)this;
  this_00 = std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::operator->
                      (&this->CacheManager);
  key_00 = (char *)std::__cxx11::string::c_str();
  local_30 = cmCacheManager::GetCacheIterator(this_00,key_00);
  bVar1 = cmCacheManager::CacheIterator::GetPropertyAsBool(&local_30,local_20);
  return bVar1;
}

Assistant:

bool cmState::GetCacheEntryPropertyAsBool(std::string const& key,
                                          std::string const& propertyName)
{
  return this->CacheManager->GetCacheIterator(key.c_str())
    .GetPropertyAsBool(propertyName);
}